

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::detail::eq_<int,_boost::ext::ut::v1_1_8::detail::integral_constant<40>_>::
eq_(eq_<int,_boost::ext::ut::v1_1_8::detail::integral_constant<40>_> *this,int *lhs,
   integral_constant<40> *rhs)

{
  bool bVar1;
  anon_class_16_2_441c8d4f local_30;
  integral_constant<40> *local_20;
  integral_constant<40> *rhs_local;
  int *lhs_local;
  eq_<int,_boost::ext::ut::v1_1_8::detail::integral_constant<40>_> *this_local;
  
  this->lhs_ = *lhs;
  local_30.lhs = lhs;
  local_30.rhs = rhs;
  local_20 = rhs;
  rhs_local = (integral_constant<40> *)lhs;
  lhs_local = &this->lhs_;
  bVar1 = eq_::anon_class_16_2_441c8d4f::operator()(&local_30);
  this->value_ = bVar1;
  return;
}

Assistant:

constexpr eq_(const TLhs& lhs = {}, const TRhs& rhs = {})
        : lhs_{lhs}, rhs_{rhs}, value_{[&] {
            using std::operator==;
            using std::operator<;

            if constexpr (type_traits::has_value_v<TLhs> and
                          type_traits::has_value_v<TRhs>) {
              return TLhs::value == TRhs::value;
            } else if constexpr (type_traits::has_epsilon_v<TLhs> and
                                 type_traits::has_epsilon_v<TRhs>) {
              return math::abs(get(lhs) - get(rhs)) <
                     math::min_value(TLhs::epsilon, TRhs::epsilon);
            } else if constexpr (type_traits::has_epsilon_v<TLhs>) {
              return math::abs(get(lhs) - get(rhs)) < TLhs::epsilon;
            } else if constexpr (type_traits::has_epsilon_v<TRhs>) {
              return math::abs(get(lhs) - get(rhs)) < TRhs::epsilon;
            } else {
              return get(lhs) == get(rhs);
            }
          }()} {}